

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damagebintobin.cpp
# Opt level: O1

void DoIt(bool validationCheck)

{
  undefined7 in_register_00000039;
  ValidateDamageBin vDBD;
  ValidateDamageBin local_3030;
  
  local_3030.super_Validate.lineno_ = 1;
  local_3030.super_Validate.warnings_ = false;
  local_3030.super_Validate.MIN_ID_ = 1;
  local_3030.prevBinIndex_ = 0;
  builtin_strncpy(local_3030.super_Validate.fileDescription_,"Damage Bin Dictionary",0x16);
  Validate::SkipHeaderRow(&local_3030.super_Validate);
  if ((int)CONCAT71(in_register_00000039,validationCheck) == 0) {
    ValidateDamageBin::ReadDamageBinDictFileNoChecks(&local_3030);
  }
  else {
    ValidateDamageBin::CheckFormat(&local_3030);
    ValidateDamageBin::CheckFirstBin(&local_3030,true);
    ValidateDamageBin::ReadDamageBinDictFile(&local_3030,true);
    ValidateDamageBin::CheckLastBin(&local_3030);
    Validate::PrintSuccessMessage(&local_3030.super_Validate);
  }
  return;
}

Assistant:

void DoIt(const bool validationCheck) {

  ValidateDamageBin vDBD;
  vDBD.SkipHeaderRow();

  if (validationCheck) {

    vDBD.CheckFormat();
    vDBD.CheckFirstBin(true);   // true = convert to binary
    vDBD.ReadDamageBinDictFile(true);   // true = convert to binary
    vDBD.CheckLastBin();
    vDBD.PrintSuccessMessage();

    return;

  }

  vDBD.ReadDamageBinDictFileNoChecks();

}